

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Automatic.cpp
# Opt level: O3

void __thiscall Automatic::fillAll(Automatic *this,int from,int to)

{
  undefined1 uVar1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  int j;
  int iVar5;
  _Rb_tree_header *p_Var6;
  char local_29;
  
  p_Var6 = &this->ac[from]._M_t._M_impl.super__Rb_tree_header;
  iVar5 = 0;
  do {
    p_Var2 = this->ac[from]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_29 = (char)iVar5;
    p_Var4 = &p_Var6->_M_header;
    if (p_Var2 == (_Base_ptr)0x0) {
LAB_00108a96:
      pmVar3 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
               operator[](this->ac + from,&local_29);
      *pmVar3 = to;
    }
    else {
      do {
        uVar1 = (undefined1)p_Var2[1]._M_color;
        if (local_29 <= (char)uVar1) {
          p_Var4 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[(char)uVar1 < local_29];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var4 == p_Var6) || (local_29 < (char)p_Var4[1]._M_color))
      goto LAB_00108a96;
    }
    iVar5 = iVar5 + 1;
    if (iVar5 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

void Automatic::fillAll(int from, int to) {
    for(int j = 0; j < 256; ++j) {
        //避免出现覆盖问题
        if (ac[from].count(char(j)) != 0) continue;
        ac[from][char(j)] = to;
    }
}